

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_region.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
* __thiscall
WorldRegion::item_sources_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
           *__return_storage_ptr__,WorldRegion *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppWVar2;
  pointer ppIVar3;
  mapped_type pIVar4;
  mapped_type *ppIVar5;
  pointer ppIVar6;
  pointer ppWVar7;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppWVar2 = (this->_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppWVar7 = (this->_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppWVar7 != ppWVar2; ppWVar7 = ppWVar7 + 1
      ) {
    ppIVar3 = ((*ppWVar7)->_item_sources).
              super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppIVar6 = ((*ppWVar7)->_item_sources).
                   super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppIVar6 != ppIVar3; ppIVar6 = ppIVar6 + 1) {
      pIVar4 = *ppIVar6;
      ppIVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
                ::operator[](__return_storage_ptr__,&pIVar4->_name);
      *ppIVar5 = pIVar4;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, ItemSource*> WorldRegion::item_sources() const
{
    std::map<std::string, ItemSource*> item_sources;
    for(WorldNode* node : _nodes)
    {
        for(ItemSource *source : node->item_sources())
            item_sources[source->name()] = source;
    }

    return item_sources;
}